

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveExecutablePathDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *path,
          bool *resolved)

{
  bool bVar1;
  
  if (executablePath->_M_string_length == 0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::_M_assign((string *)path);
    std::__cxx11::string::replace
              ((ulong)path,0,(char *)0x10,(ulong)(executablePath->_M_dataplus)._M_p);
    bVar1 = cmsys::SystemTools::PathExists(path);
  }
  *resolved = bVar1;
  return true;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveExecutablePathDependency(
  std::string const& name, std::string const& executablePath,
  std::string& path, bool& resolved)
{
  if (executablePath.empty()) {
    resolved = false;
    return true;
  }

  // 16 is == "@executable_path".length()
  path = name;
  path.replace(0, 16, executablePath);

  if (!cmSystemTools::PathExists(path)) {
    resolved = false;
    return true;
  }

  resolved = true;
  return true;
}